

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int ImTextCharToUtf8_inline(char *buf,int buf_size,uint c)

{
  byte bVar1;
  uint c_local;
  int buf_size_local;
  char *buf_local;
  
  bVar1 = (byte)c;
  if (c < 0x80) {
    *buf = bVar1;
    buf_local._4_4_ = 1;
  }
  else if (c < 0x800) {
    if (buf_size < 2) {
      buf_local._4_4_ = 0;
    }
    else {
      *buf = (char)(c >> 6) + -0x40;
      buf[1] = (bVar1 & 0x3f) + 0x80;
      buf_local._4_4_ = 2;
    }
  }
  else if (c < 0x10000) {
    if (buf_size < 3) {
      buf_local._4_4_ = 0;
    }
    else {
      *buf = (char)(c >> 0xc) + -0x20;
      buf[1] = ((byte)(c >> 6) & 0x3f) + 0x80;
      buf[2] = (bVar1 & 0x3f) + 0x80;
      buf_local._4_4_ = 3;
    }
  }
  else if (c < 0x110000) {
    if (buf_size < 4) {
      buf_local._4_4_ = 0;
    }
    else {
      *buf = (char)(c >> 0x12) + -0x10;
      buf[1] = ((byte)(c >> 0xc) & 0x3f) + 0x80;
      buf[2] = ((byte)(c >> 6) & 0x3f) + 0x80;
      buf[3] = (bVar1 & 0x3f) + 0x80;
      buf_local._4_4_ = 4;
    }
  }
  else {
    buf_local._4_4_ = 0;
  }
  return buf_local._4_4_;
}

Assistant:

static inline int ImTextCharToUtf8_inline(char* buf, int buf_size, unsigned int c)
{
    if (c < 0x80)
    {
        buf[0] = (char)c;
        return 1;
    }
    if (c < 0x800)
    {
        if (buf_size < 2) return 0;
        buf[0] = (char)(0xc0 + (c >> 6));
        buf[1] = (char)(0x80 + (c & 0x3f));
        return 2;
    }
    if (c < 0x10000)
    {
        if (buf_size < 3) return 0;
        buf[0] = (char)(0xe0 + (c >> 12));
        buf[1] = (char)(0x80 + ((c >> 6) & 0x3f));
        buf[2] = (char)(0x80 + ((c ) & 0x3f));
        return 3;
    }
    if (c <= 0x10FFFF)
    {
        if (buf_size < 4) return 0;
        buf[0] = (char)(0xf0 + (c >> 18));
        buf[1] = (char)(0x80 + ((c >> 12) & 0x3f));
        buf[2] = (char)(0x80 + ((c >> 6) & 0x3f));
        buf[3] = (char)(0x80 + ((c ) & 0x3f));
        return 4;
    }
    // Invalid code point, the max unicode is 0x10FFFF
    return 0;
}